

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMbuffer cm_get_data_buf(CManager_conflict cm,ssize_t length)

{
  int iVar1;
  __pid_t _Var2;
  CMbuffer p_Var3;
  void *pvVar4;
  pthread_t pVar5;
  uint uVar6;
  char *__format;
  FILE *pFVar7;
  ulong uVar8;
  timespec ts;
  timespec local_48;
  ulong local_38;
  
  p_Var3 = cm->cm_buffer_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMBufferVerbose);
    if (iVar1 == 0) goto LAB_0011515b;
  }
  else if (CMtrace_val[9] == 0) goto LAB_0011515b;
  if (CMtrace_PID != 0) {
    pFVar7 = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar5 = pthread_self();
    fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_48);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf called with len %zu\n",length);
LAB_0011515b:
  local_38 = length;
  fflush((FILE *)cm->CMTrace_file);
  if (p_Var3 != (CMbuffer)0x0) {
    uVar8 = 0;
    do {
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"  buffer %d %p, size is %zd, data %p, ref_count %d\n",
                uVar8,p_Var3,p_Var3->size,p_Var3->buffer,p_Var3->ref_count);
      }
      fflush((FILE *)cm->CMTrace_file);
      uVar8 = (ulong)((int)uVar8 + 1);
      p_Var3 = p_Var3->next;
    } while (p_Var3 != (_CMbuffer *)0x0);
  }
  p_Var3 = cm->cm_buffer_list;
  if (p_Var3 == (CMbuffer)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (p_Var3->ref_count < 0) {
        iVar1 = CMtrace_val[9];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(cm,CMBufferVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar7 = (FILE *)cm->CMTrace_file;
            _Var2 = getpid();
            pVar5 = pthread_self();
            fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,
                  "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n",p_Var3,
                  (ulong)(uint)p_Var3->ref_count);
        }
        fflush((FILE *)cm->CMTrace_file);
      }
      uVar6 = uVar6 + 1;
      p_Var3 = p_Var3->next;
    } while (p_Var3 != (_CMbuffer *)0x0);
  }
  uVar8 = local_38;
  for (p_Var3 = cm->cm_buffer_list; p_Var3 != (CMbuffer)0x0; p_Var3 = p_Var3->next) {
    if (((p_Var3->ref_count < 1) && (local_38 <= p_Var3->size)) && (p_Var3->size / 10 < local_38)) {
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",local_38,
                p_Var3,p_Var3->next,(ulong)uVar6);
      }
      fflush((FILE *)cm->CMTrace_file);
      p_Var3->ref_count = 1;
      return p_Var3;
    }
  }
  for (p_Var3 = cm->cm_buffer_list; p_Var3 != (CMbuffer)0x0; p_Var3 = p_Var3->next) {
    if ((p_Var3->ref_count < 1) && (local_38 <= p_Var3->size)) {
      pvVar4 = INT_CMrealloc(p_Var3->buffer,local_38);
      if (pvVar4 == (void *)0x0) {
        return (CMbuffer)0x0;
      }
      p_Var3->buffer = pvVar4;
      p_Var3->size = uVar8;
      p_Var3->ref_count = 1;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 == 0) goto LAB_00115792;
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)cm->CMTrace_file;
        _Var2 = getpid();
        pVar5 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      pFVar7 = (FILE *)cm->CMTrace_file;
      __format = "      cm_get_data_buf resizing down!  return is %p\n";
      goto LAB_00115788;
    }
  }
  p_Var3 = cm->cm_buffer_list;
  do {
    if (p_Var3 == (CMbuffer)0x0) {
      pvVar4 = INT_CMmalloc(local_38);
      p_Var3 = cm_create_transport_buffer(cm,pvVar4,uVar8);
      p_Var3->ref_count = 1;
      p_Var3->next = cm->cm_buffer_list;
      cm->cm_buffer_list = p_Var3;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar5 = pthread_self();
          uVar8 = local_38;
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf create new len %zu, return %p, count %d\n"
                ,uVar8,p_Var3,(ulong)uVar6);
      }
LAB_00115792:
      fflush((FILE *)cm->CMTrace_file);
      return p_Var3;
    }
    if ((p_Var3->ref_count < 1) && (p_Var3->size <= local_38)) {
      pvVar4 = INT_CMrealloc(p_Var3->buffer,local_38);
      if (pvVar4 == (void *)0x0) {
        return (CMbuffer)0x0;
      }
      p_Var3->buffer = pvVar4;
      p_Var3->size = uVar8;
      p_Var3->ref_count = 1;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        pFVar7 = (FILE *)cm->CMTrace_file;
        __format = "      cm_get_data_buf resizingup!  return is %p\n";
LAB_00115788:
        fprintf(pFVar7,__format,p_Var3);
      }
      goto LAB_00115792;
    }
    p_Var3 = p_Var3->next;
  } while( true );
}

Assistant:

extern CMbuffer
 cm_get_data_buf(CManager cm, ssize_t length)  
 {
     int buffer_count = 0;
     CMbuffer tmp = cm->cm_buffer_list;

     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called with len %zu\n",
		 length);
     while (tmp != NULL) {
	 CMtrace_out(cm, CMBufferVerbose, "  buffer %d %p, size is %zd, data %p, ref_count %d\n",
		     buffer_count, tmp, tmp->size, tmp->buffer, tmp->ref_count);
	 buffer_count++;
	 tmp = tmp->next;
     }

     tmp = cm->cm_buffer_list;
     buffer_count = 0;
     /* first baseline consistency check */
     while (tmp != NULL) {
	 if (tmp->ref_count < 0) {
	     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n", tmp, tmp->ref_count);
	 }
	 buffer_count++;
	 tmp = tmp->next;
     }
     /* first look for a buffer big enough, but not too big */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length) && ((tmp->size/10) < (size_t)length)) {
		 CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",
			     length, tmp, tmp->next, buffer_count);
		 tmp->ref_count = 1;
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     /* ok, we'll settle for way too big, but realloc it down */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length)) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizing down!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     tmp = cm->cm_buffer_list;
     /* well, look for a small one to realloc up */
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if (tmp->size <= (size_t)length) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizingup!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }
     tmp = cm_create_transport_buffer(cm, INT_CMmalloc(length), length);
     tmp->ref_count = 1;
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf create new len %zu, return %p, count %d\n",
		 length, tmp, buffer_count);
     return tmp;
 }